

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
::
ReadInitialValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::VarHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
           *this)

{
  int iVar1;
  int index;
  MutVariable local_48;
  double local_38;
  ArgList local_30;
  
  iVar1 = TextReader<fmt::Locale>::ReadUInt<int>(*(TextReader<fmt::Locale> **)this);
  if (**(int **)(this + 8) < iVar1) {
    local_48.
    super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
    .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_ =
         (BasicProblem<mp::BasicProblemParams<int>_> *)0x0;
    local_48.
    super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
    .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ = 0;
    local_48.
    super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
    .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>._12_4_ = 0;
    local_30.types_ = 0;
    local_30.field_1.values_ = (Value *)&local_48;
    TextReader<fmt::Locale>::DoReportError
              (*(TextReader<fmt::Locale> **)this,
               ((*(TextReader<fmt::Locale> **)this)->super_ReaderBase).token_,(CStringRef)0x22b56d,
               &local_30);
  }
  TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
  if (0 < iVar1) {
    do {
      index = NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              ::ReadUInt((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                          *)this,**(uint **)(this + 8));
      local_38 = TextReader<fmt::Locale>::ReadDouble(*(TextReader<fmt::Locale> **)this);
      BasicProblem<mp::BasicProblemParams<int>_>::MutVariable::MutVariable
                (&local_48,
                 *(BasicProblem<mp::BasicProblemParams<int>_> **)(*(long *)(this + 0x10) + 8),index)
      ;
      BasicProblem<mp::BasicProblemParams<int>_>::SetInitialValue
                (local_48.
                 super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                 .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_,
                 local_48.
                 super_BasicVariable<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                 .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_,
                 local_38);
      TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadInitialValues() {
  int num_values = reader_.ReadUInt();
  ValueHandler vh(*this);
  if (num_values > vh.num_items())
    reader_.ReportError("too many initial values");
  reader_.ReadTillEndOfLine();
  for (int i = 0; i < num_values; ++i) {
    int index = ReadUInt(vh.num_items());
    vh.SetInitialValue(index, reader_.ReadDouble());
    reader_.ReadTillEndOfLine();
  }
}